

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O1

int ON_ScaleValue::Compare(ON_ScaleValue *lhs,ON_ScaleValue *rhs)

{
  int iVar1;
  ON_SHA1_Hash local_40;
  ON_SHA1_Hash local_2c;
  
  iVar1 = -1;
  if ((rhs->m_right_to_left_scale <= lhs->m_right_to_left_scale) &&
     (iVar1 = 1, lhs->m_right_to_left_scale <= rhs->m_right_to_left_scale)) {
    ContentHash(&local_2c,lhs);
    ContentHash(&local_40,rhs);
    iVar1 = ON_SHA1_Hash::Compare(&local_2c,&local_40);
  }
  return iVar1;
}

Assistant:

int ON_ScaleValue::Compare(
  const ON_ScaleValue& lhs,
  const ON_ScaleValue& rhs
)
{
  double x = lhs.RightToLeftScale();
  double y = rhs.RightToLeftScale();
  if (x < y)
    return -1;
  if (x > y)
    return 1;
  return ON_SHA1_Hash::Compare(lhs.ContentHash(), rhs.ContentHash());
}